

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall CField::step(CField *this,pos_t *b,SState *s,path_t *path)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pEVar4;
  mapped_type *__p;
  iterator local_128;
  _Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> local_120;
  iterator local_118;
  _Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_> local_110;
  const_iterator i_1;
  allocator<char> local_f9;
  value_type local_f8;
  allocator<char> local_d1;
  value_type local_d0;
  allocator<char> local_a9;
  value_type local_a8;
  allocator<char> local_71;
  value_type local_70;
  _List_const_iterator<CField::EPriority> local_50;
  int local_48;
  int local_44;
  int ty;
  int tx;
  _List_const_iterator<CField::EPriority> local_38;
  const_iterator i;
  bool step_taken;
  bool result;
  path_t *path_local;
  SState *s_local;
  pos_t *b_local;
  CField *this_local;
  
  i._M_node._7_1_ = 0;
  i._M_node._6_1_ = 0;
  if ((s->inverted & 1U) == 0) {
    _ty = std::__cxx11::list<CField::EPriority,_std::allocator<CField::EPriority>_>::begin
                    (&this->prio);
  }
  else {
    _ty = std::__cxx11::list<CField::EPriority,_std::allocator<CField::EPriority>_>::begin
                    (&this->inv_prio);
  }
  std::_List_const_iterator<CField::EPriority>::_List_const_iterator(&local_38,(iterator *)&ty);
  do {
    local_44 = b->first;
    local_48 = b->second;
    switch(s->direction) {
    case EP_SOUTH:
      local_48 = local_48 + 1;
      break;
    case EP_EAST:
      local_44 = local_44 + 1;
      break;
    case EP_NORTH:
      local_48 = local_48 + -1;
      break;
    case EP_WEST:
      local_44 = local_44 + -1;
    }
    pvVar2 = std::
             vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
             ::operator[](&this->field,(long)local_44);
    pvVar3 = std::vector<CField::ECell,_std::allocator<CField::ECell>_>::operator[]
                       (pvVar2,(long)local_48);
    if (*pvVar3 == EC_WALL) {
LAB_001174bb:
      local_50._M_node =
           (_List_node_base *)std::_List_const_iterator<CField::EPriority>::operator++(&local_38,0);
      pEVar4 = std::_List_const_iterator<CField::EPriority>::operator*(&local_50);
      s->direction = *pEVar4;
    }
    else {
      pvVar2 = std::
               vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
               ::operator[](&this->field,(long)local_44);
      pvVar3 = std::vector<CField::ECell,_std::allocator<CField::ECell>_>::operator[]
                         (pvVar2,(long)local_48);
      if ((*pvVar3 == EC_OBSTACLE) && ((s->drunken & 1U) == 0)) goto LAB_001174bb;
      i._M_node._6_1_ = 1;
      switch(s->direction) {
      case EP_SOUTH:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"SOUTH",&local_f9);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(path,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        break;
      case EP_EAST:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"EAST",&local_71);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(path,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
        break;
      case EP_NORTH:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"NORTH",&local_a9);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(path,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator(&local_a9);
        break;
      case EP_WEST:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"WEST",&local_d1);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(path,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      std::pair<int,_int>::pair<int_&,_int_&,_true>
                ((pair<int,_int> *)((long)&i_1._M_node + 4),&local_44,&local_48);
      std::pair<int,_int>::operator=(b,(type)((long)&i_1._M_node + 4));
      pvVar2 = std::
               vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
               ::operator[](&this->field,(long)local_44);
      pvVar3 = std::vector<CField::ECell,_std::allocator<CField::ECell>_>::operator[]
                         (pvVar2,(long)local_48);
      if ((*pvVar3 == EC_OBSTACLE) && ((s->drunken & 1U) != 0)) {
        pvVar2 = std::
                 vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
                 ::operator[](&this->field,(long)local_44);
        pvVar3 = std::vector<CField::ECell,_std::allocator<CField::ECell>_>::operator[]
                           (pvVar2,(long)local_48);
        *pvVar3 = EC_NONE;
        i._M_node._7_1_ = 1;
      }
    }
    if (((i._M_node._6_1_ ^ 0xff) & 1) == 0) {
      pvVar2 = std::
               vector<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
               ::operator[](&this->field,(long)b->first);
      pvVar3 = std::vector<CField::ECell,_std::allocator<CField::ECell>_>::operator[]
                         (pvVar2,(long)b->second);
      switch(*pvVar3) {
      case EC_BEER:
        s->drunken = (bool)((s->drunken ^ 0xffU) & 1);
        break;
      default:
        break;
      case EC_EAST:
        s->direction = EP_EAST;
        break;
      case EC_INVERTOR:
        s->inverted = (bool)((s->inverted ^ 0xffU) & 1);
        break;
      case EC_NORTH:
        s->direction = EP_NORTH;
        break;
      case EC_SOUTH:
        s->direction = EP_SOUTH;
        break;
      case EC_TELEPORT:
        local_118._M_node =
             (_Base_ptr)
             std::
             map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ::find(&this->teleport,b);
        std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::
        _Rb_tree_const_iterator(&local_110,&local_118);
        local_128._M_node =
             (_Base_ptr)
             std::
             map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ::end(&this->teleport);
        std::_Rb_tree_const_iterator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>::
        _Rb_tree_const_iterator(&local_120,&local_128);
        bVar1 = std::operator!=(&local_120,&local_110);
        if (!bVar1) {
          __assert_fail("teleport.end() != i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/bender/main.cpp"
                        ,0x140,"bool CField::step(pos_t &, SState &, path_t &)");
        }
        __p = std::
              map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::operator[](&this->teleport,b);
        std::pair<int,_int>::operator=(b,__p);
        break;
      case EC_WEST:
        s->direction = EP_WEST;
      }
      return (bool)(i._M_node._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool step(pos_t& b, SState& s, path_t& path)
        {
            bool result = false;
            bool step_taken = false;
            priority_list_t::const_iterator i = s.inverted ? inv_prio.begin() : prio.begin();
            
            do
            {
                int tx = b.first;
                int ty = b.second;
                
                switch (s.direction)
                {
                    case EP_EAST:
                        tx++;
                        break;
                        
                    case EP_NORTH:
                        ty--;
                        break;
                        
                    case EP_WEST:
                        tx--;
                        break;
                        
                    case EP_SOUTH:
                        ty++;
                        break;
                }
                if (EC_WALL == field[tx][ty]
                    || (EC_OBSTACLE == field[tx][ty] && !s.drunken))
                {
                    s.direction = *(i++);
                } else
                {
                    step_taken = true;
                    switch (s.direction)
                    {
                        case EP_EAST:
                            path.push_back("EAST");
                            break;
                            
                        case EP_NORTH:
                            path.push_back("NORTH");
                            break;
                            
                        case EP_WEST:
                            path.push_back("WEST");
                            break;
                            
                        case EP_SOUTH:
                            path.push_back("SOUTH");
                            break;
                    }
                    //std::cerr << path.back() << " (" << tx << ", " << ty << ")" << std::endl;
                    b = pos_t(tx, ty);
                    if (EC_OBSTACLE == field[tx][ty] && s.drunken)
                    {
                        field[tx][ty] = EC_NONE;
                        //s.drunken = false;
                        result = true;
                    }
                }
            } while (!step_taken);
            
            switch (field[b.first][b.second])
            {
                case EC_BEER:
                    s.drunken = !s.drunken;
                    break;
                    
                case EC_INVERTOR:
                    s.inverted = !s.inverted;
                    break;
                    
                case EC_TELEPORT:
                {
                    teleport_t::const_iterator i = teleport.find(b);
                    assert(teleport.end() != i);
                    b = teleport[b];
                    break;
                }
                    
                case EC_SOUTH:
                    s.direction = EP_SOUTH;
                    break;
                    
                case EC_EAST:
                    s.direction = EP_EAST;
                    break;
                    
                case EC_NORTH:
                    s.direction = EP_NORTH;
                    break;
                    
                case EC_WEST:
                    s.direction = EP_WEST;
                    break;

                default:
                    /* do nothing */;
            }
            return result;
        }